

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O0

qint64 __thiscall
QNativeSocketEngine::readDatagram
          (QNativeSocketEngine *this,char *data,qint64 maxSize,QIpPacketHeader *header,
          PacketHeaderOptions options)

{
  long lVar1;
  QNativeSocketEnginePrivate *file;
  ulong uVar2;
  QMessageLogger *in_RCX;
  long *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QNativeSocketEnginePrivate *d;
  QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption> in_stack_00000070;
  char *in_stack_ffffffffffffff68;
  int line;
  qint64 local_60;
  char local_50 [32];
  char local_30 [8];
  QIpPacketHeader *in_stack_ffffffffffffffd8;
  qint64 in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  file = d_func((QNativeSocketEngine *)0x260107);
  uVar2 = (**(code **)(*in_RDI + 0x78))();
  line = (int)((ulong)in_RDI >> 0x20);
  if ((uVar2 & 1) == 0) {
    QMessageLogger::QMessageLogger(in_RCX,(char *)file,line,in_stack_ffffffffffffff68);
    QMessageLogger::warning
              (local_30,
               "QNativeSocketEngine::readDatagram() was called on an uninitialized socket device");
    local_60 = -1;
  }
  else if (((file->super_QAbstractSocketEnginePrivate).socketState == BoundState) ||
          ((file->super_QAbstractSocketEnginePrivate).socketState == ConnectedState)) {
    local_60 = QNativeSocketEnginePrivate::nativeReceiveDatagram
                         ((QNativeSocketEnginePrivate *)CONCAT44(in_R8D,in_stack_fffffffffffffff0),
                          in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                          in_stack_ffffffffffffffd8,(PacketHeaderOptions)in_stack_00000070.i);
  }
  else {
    QMessageLogger::QMessageLogger(in_RCX,(char *)file,line,in_stack_ffffffffffffff68);
    QMessageLogger::warning
              (local_50,
               "QNativeSocketEngine::readDatagram() was called not in QAbstractSocket::BoundState or QAbstractSocket::ConnectedState"
              );
    local_60 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_60;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QNativeSocketEngine::readDatagram(char *data, qint64 maxSize, QIpPacketHeader *header,
                                         PacketHeaderOptions options)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::readDatagram(), -1);
    Q_CHECK_STATES(QNativeSocketEngine::readDatagram(), QAbstractSocket::BoundState,
                   QAbstractSocket::ConnectedState, -1);

    return d->nativeReceiveDatagram(data, maxSize, header, options);
}